

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::iterate
          (TextureBorderClampTest *this)

{
  string *psVar1;
  TestLog *log;
  code *pcVar2;
  RenderContext *context;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  data;
  pointer data_00;
  CompareMode CVar3;
  deUint32 dVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  TextureFormat format;
  char *pcVar8;
  undefined4 extraout_var;
  RenderTarget *renderTarget;
  SeedBuilder *pSVar9;
  TypedObjectWrapper<(glu::ObjectType)7> *this_00;
  undefined4 extraout_var_00;
  byte bVar10;
  Vector<float,_4> *value;
  undefined8 uVar11;
  int iVar12;
  DepthStencilMode mode;
  long lVar13;
  undefined8 uStack_388;
  string borderColorString;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  RandomViewport viewport;
  ScopedLogSection section;
  IterationConfig iterationConfig;
  string local_2c0;
  undefined1 local_2a0 [80];
  FilterMode FStack_250;
  size_type local_24c;
  undefined8 uStack_244;
  int local_23c;
  anon_union_16_3_1194ccdc_for_v local_238;
  VertexComponentConversion local_228;
  DepthStencilMode DStack_224;
  LodMode local_220;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  string iterationDesc;
  VertexArrayBinding vertexArrays [2];
  
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (&iterationConfig,this,(ulong)(uint)this->m_iterationNdx);
  local_2c0._M_dataplus._M_p._0_4_ = this->m_iterationNdx + 1;
  de::toString<int>((string *)local_2a0,(int *)&local_2c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vertexArrays,
                 "Iteration ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
  if (iterationConfig.description._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&borderColorString,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)((long)&uStack_388 + 5));
  }
  else {
    std::operator+(&borderColorString," - ",&iterationConfig.description);
  }
  std::operator+(&iterationDesc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vertexArrays,
                 &borderColorString);
  std::__cxx11::string::~string((string *)&borderColorString);
  std::__cxx11::string::~string((string *)vertexArrays);
  std::__cxx11::string::~string((string *)local_2a0);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexArrays,"Iteration",(allocator<char> *)local_2a0);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)vertexArrays,&iterationDesc);
  std::__cxx11::string::~string((string *)vertexArrays);
  tcu::Surface::Surface(&renderedFrame,0x80,0x80);
  format = tcu::getEffectiveDepthStencilTextureFormat
                     ((TextureFormat *)
                      &((this->m_texture).
                        super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
                       .ptr)->m_refTexture,this->m_sampleMode);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2a0,TEXTURETYPE_2D);
  glu::mapGLSampler((Sampler *)vertexArrays,iterationConfig.sWrapMode,iterationConfig.tWrapMode,
                    iterationConfig.minFilter,iterationConfig.magFilter);
  local_23c = vertexArrays[0].binding.name.field_2._8_4_;
  local_24c = vertexArrays[0].binding.name._M_string_length;
  uStack_244 = vertexArrays[0].binding.name.field_2._M_allocated_capacity;
  local_2a0._68_8_ = vertexArrays[0].binding._0_8_;
  stack0xfffffffffffffdac = vertexArrays[0].binding.name._M_dataplus._M_p;
  local_228 = vertexArrays[0].pointer.convert;
  DStack_224 = vertexArrays[0].pointer.numComponents;
  local_238._0_8_ = iterationConfig.borderColor.v._0_8_;
  local_238._8_8_ = iterationConfig.borderColor.v._8_8_;
  bVar10 = this->m_useShadowSampler;
  CVar3 = COMPAREMODE_NONE;
  if ((bool)bVar10 == true) {
    CVar3 = glu::mapGLCompareFunc(iterationConfig.compareMode);
    bVar10 = this->m_useShadowSampler;
  }
  uStack_244._4_4_ = CVar3;
  mode = this->m_sampleMode;
  DStack_224 = mode;
  local_220 = LODMODE_EXACT;
  if ((bVar10 & 1) == 0) {
    local_2a0._4_4_ = glu::TextureTestUtil::getSamplerType(format);
    mode = this->m_sampleMode;
  }
  else {
    local_2a0._4_4_ = SAMPLERTYPE_SHADOW;
  }
  local_2a0._36_4_ = iterationConfig.lookupScale.m_data[0];
  local_2a0._40_4_ = iterationConfig.lookupScale.m_data[1];
  local_2a0._44_4_ = iterationConfig.lookupScale.m_data[2];
  local_2a0._48_4_ = iterationConfig.lookupScale.m_data[3];
  local_2a0._52_4_ = iterationConfig.lookupBias.m_data[0];
  local_2a0._56_4_ = iterationConfig.lookupBias.m_data[1];
  local_2a0._60_4_ = iterationConfig.lookupBias.m_data[2];
  local_2a0._64_4_ = iterationConfig.lookupBias.m_data[3];
  local_2a0._32_4_ = iterationConfig.compareRef;
  isDepthFormat(this->m_texFormat,mode);
  if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    vertexArrays[0].binding._0_8_ = iterationConfig.borderColor.v._0_8_;
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)iterationConfig.borderColor.v._8_8_;
    de::toString<tcu::Vector<unsigned_int,4>>
              (&borderColorString,(de *)vertexArrays,(Vector<unsigned_int,_4> *)value);
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    vertexArrays[0].binding._0_8_ = iterationConfig.borderColor.v._0_8_;
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)iterationConfig.borderColor.v._8_8_;
    de::toString<tcu::Vector<int,4>>(&borderColorString,(de *)vertexArrays,(Vector<int,_4> *)value);
  }
  else {
    vertexArrays[0].binding._0_8_ = iterationConfig.borderColor.v._0_8_;
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)iterationConfig.borderColor.v._8_8_;
    de::toString<tcu::Vector<float,4>>(&borderColorString,(de *)vertexArrays,value);
  }
  vertexArrays[0].binding._0_8_ =
       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar1 = &vertexArrays[0].binding.name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"Rendering full screen quad, tex coords bottom-left: ");
  tcu::operator<<((ostream *)psVar1,&iterationConfig.p0);
  std::operator<<((ostream *)psVar1,", top-right ");
  tcu::operator<<((ostream *)psVar1,&iterationConfig.p1);
  std::operator<<((ostream *)psVar1,"\n");
  std::operator<<((ostream *)psVar1,"Border color is ");
  std::operator<<((ostream *)psVar1,(string *)&borderColorString);
  std::operator<<((ostream *)psVar1,"\n");
  std::operator<<((ostream *)psVar1,"Texture lookup bias: ");
  tcu::operator<<((ostream *)psVar1,(Vector<float,_4> *)(local_2a0 + 0x34));
  std::operator<<((ostream *)psVar1,"\n");
  std::operator<<((ostream *)psVar1,"Texture lookup scale: ");
  tcu::operator<<((ostream *)psVar1,(Vector<float,_4> *)(local_2a0 + 0x24));
  std::operator<<((ostream *)psVar1,"\n");
  std::operator<<((ostream *)psVar1,"Filters: min = ");
  dVar4 = glu::getGLFilterMode(FStack_250);
  pcVar8 = glu::getTextureFilterName(dVar4);
  std::operator<<((ostream *)psVar1,pcVar8);
  std::operator<<((ostream *)psVar1,", mag = ");
  dVar4 = glu::getGLFilterMode((FilterMode)local_24c);
  pcVar8 = glu::getTextureFilterName(dVar4);
  std::operator<<((ostream *)psVar1,pcVar8);
  std::operator<<((ostream *)psVar1,"\n");
  std::operator<<((ostream *)psVar1,"Wrap mode: s = ");
  local_2c0._M_dataplus._M_p = (pointer)glu::getRepeatModeName;
  local_2c0._M_string_length._0_4_ = iterationConfig.sWrapMode;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2c0,(ostream *)psVar1);
  std::operator<<((ostream *)psVar1,", t = ");
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)glu::getRepeatModeName;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,iterationConfig.tWrapMode);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&texCoord,(ostream *)psVar1);
  std::operator<<((ostream *)psVar1,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  if (this->m_sampleMode == MODE_STENCIL) {
    vertexArrays[0].binding._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Depth stencil texture mode is STENCIL_INDEX");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012a5203:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexArrays[0].binding.name);
  }
  else if (this->m_sampleMode == MODE_DEPTH) {
    vertexArrays[0].binding._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Depth stencil texture mode is DEPTH_COMPONENT");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_012a5203;
  }
  if (iterationConfig.compareMode != 0) {
    vertexArrays[0].binding._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Texture mode is COMPARE_REF_TO_TEXTURE, mode = ");
    local_2c0._M_dataplus._M_p = (pointer)glu::getCompareFuncName;
    local_2c0._M_string_length._0_4_ = iterationConfig.compareMode;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2c0,(ostream *)psVar1);
    std::operator<<((ostream *)psVar1,"\n");
    std::operator<<((ostream *)psVar1,"Compare reference value = ");
    std::ostream::operator<<(psVar1,iterationConfig.compareRef);
    std::operator<<((ostream *)psVar1,"\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  }
  std::__cxx11::string::~string((string *)&borderColorString);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar5);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::SeedBuilder::SeedBuilder((SeedBuilder *)&borderColorString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexArrays,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p,
             (allocator<char> *)&local_2c0);
  pSVar9 = tcu::operator<<((SeedBuilder *)&borderColorString,(string *)vertexArrays);
  pSVar9 = tcu::operator<<(pSVar9,this->m_iterationNdx);
  pSVar9 = tcu::operator<<(pSVar9,this->m_texFormat);
  pSVar9 = tcu::operator<<(pSVar9,iterationConfig.minFilter);
  pSVar9 = tcu::operator<<(pSVar9,iterationConfig.magFilter);
  pSVar9 = tcu::operator<<(pSVar9,(((this->m_texture).
                                    super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>
                                    .m_data.ptr)->m_refTexture).m_width);
  tcu::operator<<(pSVar9,(((this->m_texture).
                           super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                           m_data.ptr)->m_refTexture).m_height);
  std::__cxx11::string::~string((string *)vertexArrays);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,renderTarget,0x80,0x80,(deUint32)borderColorString._M_dataplus._M_p);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sampler.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)0x0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&iterationConfig.p0,&iterationConfig.p1);
  (**(code **)(lVar13 + 8))(0x84c0);
  (**(code **)(lVar13 + 0xb8))
            (0xde1,((this->m_texture).
                    super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr
                   )->m_glTexture);
  if (this->m_sampleMode == MODE_DEPTH) {
    uVar11 = 0x1902;
  }
  else {
    if (this->m_sampleMode != MODE_STENCIL) goto LAB_012a540d;
    uVar11 = 0x1901;
  }
  (**(code **)(lVar13 + 0x1360))(0xde1,0x90ea,uVar11);
LAB_012a540d:
  if (iterationConfig.compareMode == 0) {
    dVar4 = 0x207;
    (**(code **)(lVar13 + 0x1360))(0xde1,0x884c,0);
  }
  else {
    (**(code **)(lVar13 + 0x1360))(0xde1,0x884c,0x884e);
    dVar4 = iterationConfig.compareMode;
  }
  (**(code **)(lVar13 + 0x1360))(0xde1,0x884d,dVar4);
  if (this->m_stateType == STATE_SAMPLER_PARAM) {
    vertexArrays[0].binding.type = TYPE_LOCATION;
    vertexArrays[0].binding._4_4_ = 0;
    vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2802,0x2901);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2803,0x2901);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar13 + 0x1358))(0xde1,0x1004,vertexArrays);
    this_00 = (TypedObjectWrapper<(glu::ObjectType)7> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper
              (this_00,((this->super_TestCase).m_context)->m_renderCtx);
    borderColorString._M_dataplus._M_p._0_4_ = 0;
    borderColorString._M_dataplus._M_p._4_4_ = 0;
    data._8_8_ = 0;
    data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)uStack_388;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
    ::assignData(&sampler.
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                 ,data);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                   *)&borderColorString);
    pcVar2 = *(code **)(lVar13 + 0x1280);
    dVar4 = ((sampler.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
              .m_data.ptr)->super_ObjectWrapper).m_object;
    dVar6 = glu::getGLWrapMode(local_2a0._68_4_);
    (*pcVar2)(dVar4,0x2802,dVar6);
    pcVar2 = *(code **)(lVar13 + 0x1280);
    dVar4 = ((sampler.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
              .m_data.ptr)->super_ObjectWrapper).m_object;
    dVar6 = glu::getGLWrapMode(local_2a0._72_4_);
    (*pcVar2)(dVar4,0x2803,dVar6);
    pcVar2 = *(code **)(lVar13 + 0x1280);
    dVar4 = ((sampler.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
              .m_data.ptr)->super_ObjectWrapper).m_object;
    dVar6 = glu::getGLFilterMode(FStack_250);
    (*pcVar2)(dVar4,0x2801,dVar6);
    pcVar2 = *(code **)(lVar13 + 0x1280);
    dVar4 = ((sampler.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
              .m_data.ptr)->super_ObjectWrapper).m_object;
    dVar6 = glu::getGLFilterMode((FilterMode)local_24c);
    (*pcVar2)(dVar4,0x2800,dVar6);
    if ((ulong)this->m_channelClass < 5) {
      (**(code **)(lVar13 + *(long *)(&DAT_018b15a8 + (ulong)this->m_channelClass * 8)))
                (((sampler.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object,0x1004,&iterationConfig.borderColor);
    }
    (**(code **)(lVar13 + 0xa8))
              (0,((sampler.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
  }
  else if (this->m_stateType == STATE_TEXTURE_PARAM) {
    pcVar2 = *(code **)(lVar13 + 0x1360);
    dVar4 = glu::getGLWrapMode(local_2a0._68_4_);
    (*pcVar2)(0xde1,0x2802,dVar4);
    pcVar2 = *(code **)(lVar13 + 0x1360);
    dVar4 = glu::getGLWrapMode(local_2a0._72_4_);
    (*pcVar2)(0xde1,0x2803,dVar4);
    pcVar2 = *(code **)(lVar13 + 0x1360);
    dVar4 = glu::getGLFilterMode(FStack_250);
    (*pcVar2)(0xde1,0x2801,dVar4);
    pcVar2 = *(code **)(lVar13 + 0x1360);
    dVar4 = glu::getGLFilterMode((FilterMode)local_24c);
    (*pcVar2)(0xde1,0x2800,dVar4);
    if ((ulong)this->m_channelClass < 5) {
      (**(code **)(lVar13 + *(long *)(&DAT_018b15f8 + (ulong)this->m_channelClass * 8)))
                (0xde1,0x1004,&iterationConfig.borderColor);
    }
  }
  dVar4 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x35f);
  (**(code **)(lVar13 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  data_00 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this->m_samplingFunction == SAMPLE_FILTER) {
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              ((this->m_renderer).
               super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
               .m_data.ptr,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_2a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&borderColorString,"a_position",(allocator<char> *)((long)&uStack_388 + 7))
    ;
    glu::va::Float(vertexArrays,&borderColorString,4,4,0,
                   (float *)Functional::(anonymous_namespace)::TextureBorderClampTest::
                            renderQuad(float_const*,glu::TextureTestUtil::ReferenceParams_const&)::
                            position);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"a_texcoord",(allocator<char> *)((long)&uStack_388 + 6));
    glu::va::Float(vertexArrays + 1,&local_2c0,2,4,0,data_00);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&borderColorString);
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar13 = CONCAT44(extraout_var_00,iVar5);
    dVar4 = (((this->m_gatherProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
             ptr)->m_program).m_program;
    (**(code **)(lVar13 + 0x1680))(dVar4);
    pcVar2 = *(code **)(lVar13 + 0x14f0);
    uVar7 = (**(code **)(lVar13 + 0xb48))(dVar4,"u_sampler");
    (*pcVar2)(uVar7,0);
    if (this->m_useShadowSampler == true) {
      pcVar2 = *(code **)(lVar13 + 0x14e0);
      uVar7 = (**(code **)(lVar13 + 0xb48))(dVar4,"u_ref");
      (*pcVar2)(local_2a0._32_4_,uVar7);
    }
    pcVar2 = *(code **)(lVar13 + 0x15a8);
    uVar7 = (**(code **)(lVar13 + 0xb48))(dVar4,"u_colorScale");
    (*pcVar2)(uVar7,1,(Vector<float,_4> *)(local_2a0 + 0x24));
    pcVar2 = *(code **)(lVar13 + 0x15a8);
    uVar7 = (**(code **)(lVar13 + 0xb48))(dVar4,"u_colorBias");
    (*pcVar2)(uVar7,1,local_2a0 + 0x34);
    borderColorString._M_dataplus._M_p._0_4_ = 0;
    borderColorString._M_dataplus._M_p._4_4_ = 6;
    borderColorString._M_string_length._0_4_ = 1;
    borderColorString.field_2._M_allocated_capacity =
         (size_type)
         Functional::(anonymous_namespace)::TextureBorderClampTest::
         renderQuad(float_const*,glu::TextureTestUtil::ReferenceParams_const&)::indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar4,2,vertexArrays,
              (PrimitiveList *)&borderColorString,(DrawUtilCallback *)0x0);
    lVar13 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar13));
      lVar13 = lVar13 + -0x50;
    } while (lVar13 != -0x48);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)vertexArrays,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)vertexArrays);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::~UniqueBase(&sampler.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
               );
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  verifyImage(this,&renderedFrame,&iterationConfig,(ReferenceParams *)local_2a0);
  iVar12 = this->m_iterationNdx + 1;
  this->m_iterationNdx = iVar12;
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  if (iVar12 == iVar5) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  tcu::Surface::~Surface(&renderedFrame);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDesc);
  std::__cxx11::string::~string((string *)&iterationConfig.description);
  return (uint)(iVar12 != iVar5);
}

Assistant:

TextureBorderClampTest::IterateResult TextureBorderClampTest::iterate (void)
{
	const IterationConfig						iterationConfig		= getIteration(m_iterationNdx);
	const std::string							iterationDesc		= "Iteration " + de::toString(m_iterationNdx+1) + (iterationConfig.description.empty() ? ("") : (" - " + iterationConfig.description));
	const tcu::ScopedLogSection					section				(m_testCtx.getLog(), "Iteration", iterationDesc);
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= genSamplerParams(iterationConfig);

	logParams(iterationConfig, samplerParams);
	renderTo(renderedFrame, iterationConfig, samplerParams);
	verifyImage(renderedFrame, iterationConfig, samplerParams);

	if (++m_iterationNdx == getNumIterations())
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	return CONTINUE;
}